

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

int simple_test(ilzham *lzham_dll,comp_options *options)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  lzham_decompress_status_t decomp_status;
  uint i;
  timer tm;
  lzham_uint32 decomp_adler32;
  size_t decomp_size;
  lzham_uint8 decomp_buf [1024];
  lzham_decompress_params decomp_params;
  lzham_compress_status_t comp_status;
  lzham_uint32 comp_adler32;
  size_t uncomp_len;
  char *p;
  size_t cmp_len;
  lzham_uint8 cmp_buf [1024];
  lzham_compress_params comp_params;
  timer *in_stack_fffffffffffff730;
  timer *in_stack_fffffffffffff738;
  int local_8b4;
  size_t local_8b0;
  undefined1 local_8a8 [1032];
  undefined4 local_4a0;
  undefined4 local_49c;
  uint local_494;
  uint local_478;
  int local_474;
  ulong local_470;
  char *local_468;
  ulong local_460;
  undefined1 local_458 [88];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_40;
  long local_18;
  long local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  printf("\n");
  printf("LZHAM simple memory to memory compression test\n");
  memset(&local_50,0,0x38);
  local_50 = 0x38;
  local_4c = 0x1a;
  local_48 = 4;
  local_40 = 1;
  local_460 = 0x400;
  local_468 = 
  "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456";
  local_470 = strlen(
                    "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                    );
  local_474 = 0;
  local_478 = (**(code **)(local_10 + 0x40))
                        (&local_50,local_458,&local_460,local_468,local_470,&local_474);
  if (local_478 == 3) {
    printf("Uncompressed size: %u\nCompressed size: %u\n",local_470 & 0xffffffff,
           local_460 & 0xffffffff);
    memset(&local_4a0,0,0x28);
    local_4a0 = 0x28;
    local_49c = local_4c;
    if ((*(byte *)(local_18 + 8) & 1) != 0) {
      local_494 = local_494 | 2;
    }
    local_8b0 = 0x400;
    local_8b4 = 0;
    timer::timer((timer *)0x10adab);
    timer::start(in_stack_fffffffffffff730);
    bVar1 = false;
    while (!bVar1) {
      uVar2 = (**(code **)(local_10 + 0x68))
                        (&local_4a0,local_8a8,&local_8b0,local_458,local_460,&local_8b4);
      if (uVar2 != 3) {
        print_error("Compression test failed with status %i!\n",(ulong)uVar2);
        return 1;
      }
      if (((local_474 != local_8b4) || (local_8b0 != local_470)) ||
         (iVar3 = memcmp(local_8a8,local_468,local_470), iVar3 != 0)) {
        print_error("Compression test failed!\n");
        return 1;
      }
      bVar1 = true;
    }
    timer::get_elapsed_secs(in_stack_fffffffffffff738);
    printf("Decompress time: %3.6f secs\n");
    printf("Compression test succeeded.\n");
    local_4 = 0;
  }
  else {
    print_error("Compression test failed with status %i!\n",(ulong)local_478);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int simple_test(ilzham &lzham_dll, const comp_options &options)
{
   printf("\n");
   printf("LZHAM simple memory to memory compression test\n");

   lzham_compress_params comp_params;
   memset(&comp_params, 0, sizeof(comp_params));
   comp_params.m_struct_size = sizeof(comp_params);
   comp_params.m_dict_size_log2 = 26;
   comp_params.m_level = LZHAM_COMP_LEVEL_UBER;
   comp_params.m_max_helper_threads = 1;

   lzham_uint8 cmp_buf[1024];
   size_t cmp_len = sizeof(cmp_buf);

   const char *p = "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456";
   size_t uncomp_len = strlen(p);

   lzham_uint32 comp_adler32 = 0;
   lzham_compress_status_t comp_status = lzham_dll.lzham_compress_memory(&comp_params, cmp_buf, &cmp_len, (const lzham_uint8 *)p, uncomp_len, &comp_adler32);
   if (comp_status != LZHAM_COMP_STATUS_SUCCESS)
   {
      print_error("Compression test failed with status %i!\n", comp_status);
      return EXIT_FAILURE;
   }

   printf("Uncompressed size: %u\nCompressed size: %u\n", (uint)uncomp_len, (uint)cmp_len);

   lzham_decompress_params decomp_params;
   memset(&decomp_params, 0, sizeof(decomp_params));
   decomp_params.m_struct_size = sizeof(decomp_params);
   decomp_params.m_dict_size_log2 = comp_params.m_dict_size_log2;
   if (options.m_compute_adler32_during_decomp)
      decomp_params.m_decompress_flags |= LZHAM_DECOMP_FLAG_COMPUTE_ADLER32;

   lzham_uint8 decomp_buf[1024];
   size_t decomp_size = sizeof(decomp_buf);
   lzham_uint32 decomp_adler32 = 0;
   timer tm;
   tm.start();
   //for (uint i = 0; i < 400000; i++)
   for (uint i = 0; i < 1; i++)
   {
      lzham_decompress_status_t decomp_status = lzham_dll.lzham_decompress_memory(&decomp_params, decomp_buf, &decomp_size, cmp_buf, cmp_len, &decomp_adler32);
      if (decomp_status != LZHAM_DECOMP_STATUS_SUCCESS)
      {
         print_error("Compression test failed with status %i!\n", decomp_status);
         return EXIT_FAILURE;
      }

      if ((comp_adler32 != decomp_adler32) || (decomp_size != uncomp_len) || (memcmp(decomp_buf, p, uncomp_len)))
      {
         print_error("Compression test failed!\n");
         return EXIT_FAILURE;
      }
   }
   printf("Decompress time: %3.6f secs\n", tm.get_elapsed_secs());

   printf("Compression test succeeded.\n");

   return EXIT_SUCCESS;
}